

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaDebug.cpp
# Opt level: O3

double __thiscall
HSimplexNla::debugInvertResidualError
          (HSimplexNla *this,bool transposed,HVector *solution,HVector *residual)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  HighsLp *pHVar5;
  HighsInt *pHVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer piVar9;
  pointer pdVar10;
  ulong uVar11;
  undefined7 in_register_00000031;
  ulong uVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  
  pHVar5 = this->lp_;
  pHVar6 = this->basic_index_;
  iVar1 = pHVar5->num_col_;
  uVar2 = pHVar5->num_row_;
  uVar11 = (ulong)uVar2;
  if ((int)CONCAT71(in_register_00000031,transposed) == 0) {
    if ((int)uVar2 < 1) {
      return 0.0;
    }
    pdVar7 = (solution->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (residual->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0;
    do {
      dVar14 = pdVar7[uVar12];
      iVar3 = pHVar6[uVar12];
      if (iVar3 < iVar1) {
        piVar9 = (pHVar5->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = piVar9[iVar3];
        lVar13 = (long)iVar4;
        iVar3 = piVar9[(long)iVar3 + 1];
        if (iVar4 < iVar3) {
          piVar9 = (pHVar5->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar10 = (pHVar5->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            iVar4 = piVar9[lVar13];
            pdVar8[iVar4] = pdVar10[lVar13] * -dVar14 + pdVar8[iVar4];
            lVar13 = lVar13 + 1;
          } while (iVar3 != lVar13);
        }
      }
      else {
        pdVar8[iVar3 - iVar1] = pdVar8[iVar3 - iVar1] - dVar14;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar11);
  }
  else {
    if ((int)uVar2 < 1) {
      return 0.0;
    }
    pdVar7 = (solution->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (residual->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0;
    do {
      iVar3 = pHVar6[uVar12];
      if (iVar3 < iVar1) {
        piVar9 = (pHVar5->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = piVar9[iVar3];
        lVar13 = (long)iVar4;
        iVar3 = piVar9[(long)iVar3 + 1];
        if (iVar4 < iVar3) {
          piVar9 = (pHVar5->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar10 = (pHVar5->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          dVar14 = pdVar8[uVar12];
          do {
            dVar14 = dVar14 - pdVar7[piVar9[lVar13]] * pdVar10[lVar13];
            pdVar8[uVar12] = dVar14;
            lVar13 = lVar13 + 1;
          } while (iVar3 != lVar13);
        }
      }
      else {
        pdVar8[uVar12] = pdVar8[uVar12] - pdVar7[iVar3 - iVar1];
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar11);
  }
  if ((int)uVar2 < 1) {
    return 0.0;
  }
  dVar14 = 0.0;
  uVar12 = 0;
  do {
    dVar15 = ABS((residual->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12]);
    if (dVar14 <= dVar15) {
      dVar14 = dVar15;
    }
    uVar12 = uVar12 + 1;
  } while (uVar11 != uVar12);
  return dVar14;
}

Assistant:

double HSimplexNla::debugInvertResidualError(const bool transposed,
                                             const HVector& solution,
                                             HVector& residual) const {
  const HighsInt num_row = this->lp_->num_row_;
  const HighsInt num_col = this->lp_->num_col_;
  const vector<HighsInt>& a_matrix_start = this->lp_->a_matrix_.start_;
  const vector<HighsInt>& a_matrix_index = this->lp_->a_matrix_.index_;
  const vector<double>& a_matrix_value = this->lp_->a_matrix_.value_;
  const HighsInt* basic_index = this->basic_index_;

  if (transposed) {
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      HighsInt iCol = basic_index[iRow];
      if (iCol < num_col) {
        for (HighsInt iEl = a_matrix_start[iCol];
             iEl < a_matrix_start[iCol + 1]; iEl++) {
          HighsInt index = a_matrix_index[iEl];
          double value = solution.array[index];
          residual.array[iRow] -= value * a_matrix_value[iEl];
        }
      } else {
        HighsInt index = iCol - num_col;
        double value = solution.array[index];
        residual.array[iRow] -= value;
      }
    }
  } else {
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      double value = solution.array[iRow];
      HighsInt iCol = basic_index[iRow];
      if (iCol < num_col) {
        for (HighsInt iEl = a_matrix_start[iCol];
             iEl < a_matrix_start[iCol + 1]; iEl++) {
          HighsInt index = a_matrix_index[iEl];
          residual.array[index] -= value * a_matrix_value[iEl];
        }
      } else {
        HighsInt index = iCol - num_col;
        residual.array[index] -= value;
      }
    }
  }

  double residual_error_norm = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    double residual_error = fabs(residual.array[iRow]);
    residual_error_norm = std::max(residual_error, residual_error_norm);
  }
  return residual_error_norm;
}